

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

Vec_Int_t * Fra_ImpDerive(Fra_Man_t *p,int nImpMaxLimit,int nImpUseLimit,int fLatchCorr)

{
  uint Left;
  Vec_Int_t *pVVar1;
  Fra_Sml_t *pFVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  int *piVar5;
  int *piVar6;
  uint *puVar7;
  Vec_Int_t *pVVar8;
  void *__ptr;
  abctime aVar9;
  uint uVar10;
  long lVar11;
  Fra_Sml_t *p_01;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a4;
  uint local_9c;
  uint local_98;
  int CostRange;
  int *local_90;
  Fra_Sml_t *local_88;
  int local_80;
  int local_7c;
  uint local_78;
  uint local_74;
  Fra_Sml_t *local_70;
  Vec_Int_t *local_68;
  abctime local_60;
  Fra_Man_t *local_58;
  Fra_Sml_t *local_50;
  uint *local_48;
  int *local_40;
  long local_38;
  
  local_60 = Abc_Clock();
  if (0x7fff < p->pManAig->vObjs->nSize) {
    __assert_fail("Aig_ManObjNumMax(p->pManAig) < (1 << 15)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x14c,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  if (((nImpMaxLimit < nImpUseLimit) || (nImpMaxLimit < 1)) || (nImpUseLimit < 1)) {
    __assert_fail("nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                  ,0x14d,"Vec_Int_t *Fra_ImpDerive(Fra_Man_t *, int, int, int)");
  }
  uVar10 = 0;
  local_7c = nImpUseLimit;
  local_70 = Fra_SmlSimulateComb(p->pManAig,0x40,0);
  local_58 = p;
  local_88 = Fra_SmlSimulateSeq(p->pManAig,p->pPars->nFramesP,0x40,1,1);
  p_00 = Fra_SmlSortUsingOnes(local_88,fLatchCorr);
  iVar3 = 0x800;
  while (iVar4 = iVar3, iVar12 = iVar4, iVar4 != 0) {
    while (iVar13 = iVar12 + -1, iVar3 = iVar4 + -1, 1 < iVar12) {
      for (piVar5 = (int *)Vec_PtrEntry(p_00,iVar13); iVar12 = iVar13, *piVar5 != 0;
          piVar5 = piVar5 + 1) {
        for (piVar6 = (int *)Vec_PtrEntry(p_00,iVar4); *piVar6 != 0; piVar6 = piVar6 + 1) {
          uVar10 = uVar10 + 1;
        }
      }
    }
  }
  local_90 = (int *)malloc((ulong)(uint)nImpMaxLimit << 2);
  local_68 = Vec_IntAlloc(nImpMaxLimit);
  local_50 = local_70 + 1;
  local_b0 = 1000000000;
  local_ac = 0;
  local_9c = 0;
  local_98 = 0;
  local_a4 = 0;
  local_b4 = 0;
  p_01 = local_70;
  for (iVar3 = local_88->nWordsTotal << 5; iVar12 = iVar3, 0 < iVar3; iVar3 = iVar3 + -1) {
    while (1 < iVar12) {
      local_80 = iVar12 + -1;
      puVar7 = (uint *)Vec_PtrEntry(p_00,local_80);
      while (iVar12 = local_80, *puVar7 != 0) {
        local_48 = puVar7;
        piVar5 = (int *)Vec_PtrEntry(p_00,iVar3);
        while (iVar12 = *piVar5, iVar12 != 0) {
          local_ac = local_ac + 1;
          Left = *local_48;
          local_40 = piVar5;
          iVar4 = Sml_NodeCheckImp(local_88,Left,iVar12);
          if (iVar4 == 0) {
            local_9c = local_9c + 1;
          }
          else {
            iVar4 = Sml_NodeCheckImp(p_01,Left,iVar12);
            pFVar2 = local_50;
            if (iVar4 == 0) {
              iVar4 = p_01->nWordsTotal;
              local_38 = (long)&local_50->pAig + (long)(int)(iVar4 * Left) * 4;
              local_78 = iVar12 << 0x10;
              uVar14 = 0;
              local_74 = Left;
              for (lVar11 = (long)p_01->nWordsPref; pVVar1 = local_68, lVar11 < iVar4;
                  lVar11 = lVar11 + 1) {
                iVar13 = Aig_WordCountOnes(~*(uint *)((long)&pFVar2->pAig +
                                                     lVar11 * 4 + (long)(iVar4 * iVar12) * 4) &
                                           *(uint *)(local_38 + lVar11 * 4));
                uVar14 = uVar14 + iVar13;
              }
              local_a4 = local_a4 + 1;
              if ((int)uVar14 <= (int)local_b0) {
                local_b0 = uVar14;
              }
              local_90[local_68->nSize] = uVar14;
              if ((int)uVar14 < (int)local_b4) {
                uVar14 = local_b4;
              }
              local_b4 = uVar14;
              Vec_IntPush(local_68,local_74 | local_78);
              p_01 = local_70;
              if (pVVar1->nSize == nImpMaxLimit) goto LAB_005586ea;
            }
            else {
              local_98 = local_98 + 1;
            }
          }
          piVar5 = local_40 + 1;
        }
        puVar7 = local_48 + 1;
      }
    }
  }
LAB_005586ea:
  Fra_SmlStop(p_01);
  Fra_SmlStop(local_88);
  pVVar1 = local_68;
  piVar5 = local_90;
  CostRange = local_b0;
  pVVar8 = local_68;
  if (local_7c < local_68->nSize) {
    pVVar8 = Fra_SmlSelectMaxCost(local_68,local_90,0x800,local_7c,&CostRange);
    free(pVVar1->pArray);
    free(pVVar1);
  }
  free(piVar5);
  __ptr = Vec_PtrEntry(p_00,0);
  free(__ptr);
  free(p_00->pArray);
  free(p_00);
  qsort(pVVar8->pArray,(long)pVVar8->nSize,4,Sml_CompareMaxId);
  if (local_58->pPars->fVerbose != 0) {
    printf("Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n",(ulong)uVar10,
           (ulong)local_ac,(ulong)local_9c,(ulong)local_98,(ulong)local_a4);
    iVar3 = 0x847703;
    printf("Implication weight: Min = %d. Pivot = %d. Max = %d.   ",(ulong)local_b0,
           (ulong)(uint)CostRange,(ulong)local_b4);
    Abc_Print(iVar3,"%s =","Time");
    aVar9 = Abc_Clock();
    Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar9 - local_60) / 1000000.0);
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Fra_ImpDerive( Fra_Man_t * p, int nImpMaxLimit, int nImpUseLimit, int fLatchCorr )
{
    int nSimWords = 64;
    Fra_Sml_t * pSeq, * pComb;
    Vec_Int_t * vImps, * vTemp;
    Vec_Ptr_t * vNodes;
    int * pImpCosts, * pNodesI, * pNodesK;
    int nImpsTotal = 0, nImpsTried = 0, nImpsNonSeq = 0, nImpsComb = 0, nImpsCollected = 0;
    int CostMin = ABC_INFINITY, CostMax = 0;
    int i, k, Imp, CostRange;
    abctime clk = Abc_Clock();
    assert( Aig_ManObjNumMax(p->pManAig) < (1 << 15) );
    assert( nImpMaxLimit > 0 && nImpUseLimit > 0 && nImpUseLimit <= nImpMaxLimit );
    // normalize both managers
    pComb = Fra_SmlSimulateComb( p->pManAig, nSimWords, 0 );
    pSeq = Fra_SmlSimulateSeq( p->pManAig, p->pPars->nFramesP, nSimWords, 1, 1 );
    // get the nodes sorted by the number of 1s
    vNodes = Fra_SmlSortUsingOnes( pSeq, fLatchCorr );
    // count the total number of implications
    for ( k = nSimWords * 32; k > 0; k-- )
    for ( i = k - 1; i > 0; i-- )
    for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
    for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
        nImpsTotal++;

    // compute implications and their costs
    pImpCosts = ABC_ALLOC( int, nImpMaxLimit );
    vImps = Vec_IntAlloc( nImpMaxLimit );
    for ( k = pSeq->nWordsTotal * 32; k > 0; k-- )
        for ( i = k - 1; i > 0; i-- )
        {
            // HERE WE ARE MISSING SOME POTENTIAL IMPLICATIONS (with complement!)

            for ( pNodesI = (int *)Vec_PtrEntry( vNodes, i ); *pNodesI; pNodesI++ )
            for ( pNodesK = (int *)Vec_PtrEntry( vNodes, k ); *pNodesK; pNodesK++ )
            {
                nImpsTried++;
                if ( !Sml_NodeCheckImp(pSeq, *pNodesI, *pNodesK) )
                {
                    nImpsNonSeq++;
                    continue;
                }
                if ( Sml_NodeCheckImp(pComb, *pNodesI, *pNodesK) )
                {
                    nImpsComb++;
                    continue;
                }
                nImpsCollected++;
                Imp = Fra_ImpCreate( *pNodesI, *pNodesK );
                pImpCosts[ Vec_IntSize(vImps) ] = Sml_NodeNotImpWeight(pComb, *pNodesI, *pNodesK);
                CostMin = Abc_MinInt( CostMin, pImpCosts[ Vec_IntSize(vImps) ] );
                CostMax = Abc_MaxInt( CostMax, pImpCosts[ Vec_IntSize(vImps) ] );
                Vec_IntPush( vImps, Imp );
                if ( Vec_IntSize(vImps) == nImpMaxLimit )
                    goto finish;
            } 
        }
finish:
    Fra_SmlStop( pComb );
    Fra_SmlStop( pSeq );

    // select implications with the highest cost
    CostRange = CostMin;
    if ( Vec_IntSize(vImps) > nImpUseLimit )
    {
        vImps = Fra_SmlSelectMaxCost( vTemp = vImps, pImpCosts, nSimWords * 32, nImpUseLimit, &CostRange );
        Vec_IntFree( vTemp );  
    }

    // dealloc
    ABC_FREE( pImpCosts ); 
    {
    void * pTemp = Vec_PtrEntry(vNodes, 0);
    ABC_FREE( pTemp );
    }
    Vec_PtrFree( vNodes );
    // reorder implications topologically
    qsort( (void *)Vec_IntArray(vImps), (size_t)Vec_IntSize(vImps), sizeof(int), 
            (int (*)(const void *, const void *)) Sml_CompareMaxId );
if ( p->pPars->fVerbose )
{
printf( "Implications: All = %d. Try = %d. NonSeq = %d. Comb = %d. Res = %d.\n", 
    nImpsTotal, nImpsTried, nImpsNonSeq, nImpsComb, nImpsCollected );
printf( "Implication weight: Min = %d. Pivot = %d. Max = %d.   ", 
       CostMin, CostRange, CostMax );
ABC_PRT( "Time", Abc_Clock() - clk );
}
    return vImps;
}